

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt strscan_oct(uint8_t *p,TValue *o,StrScanFmt fmt,int32_t neg,uint32_t dig)

{
  uint32_t uVar1;
  StrScanFmt SVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  
  SVar2 = STRSCAN_ERROR;
  if (dig < 0x17) {
    uVar4 = (ulong)dig;
    if (dig != 0) {
      if ((dig == 0x16) && (0x31 < *p)) {
        return STRSCAN_ERROR;
      }
      lVar5 = 0;
      uVar4 = 0;
      do {
        if ((p[lVar5] & 0xf8) != 0x30) {
          return STRSCAN_ERROR;
        }
        uVar4 = (ulong)(p[lVar5] & 7) + uVar4 * 8;
        lVar5 = lVar5 + 1;
      } while (dig != (uint32_t)lVar5);
    }
    if (fmt != STRSCAN_U32) {
      if (fmt != STRSCAN_INT) {
        uVar3 = -uVar4;
        if (neg == 0) {
          uVar3 = uVar4;
        }
        o->u64 = uVar3;
        return fmt;
      }
      fmt = STRSCAN_U32 - (uVar4 < (neg | 0x80000000));
    }
    if (uVar4 >> 0x20 == 0) {
      uVar1 = -(uint32_t)uVar4;
      if (neg == 0) {
        uVar1 = (uint32_t)uVar4;
      }
      (o->u32).lo = uVar1;
      SVar2 = fmt;
    }
  }
  return SVar2;
}

Assistant:

static StrScanFmt strscan_oct(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;

  /* Scan octal digits. */
  if (dig > 22 || (dig == 22 && *p > '1')) return STRSCAN_ERROR;
  while (dig-- > 0) {
    if (!(*p >= '0' && *p <= '7')) return STRSCAN_ERROR;
    x = (x << 3) + (*p++ & 7);
  }

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (x >= 0x80000000u+neg) fmt = STRSCAN_U32;
    /* fallthrough */
  case STRSCAN_U32:
    if ((x >> 32)) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~(uint32_t)x+1u) : (int32_t)x;
    break;
  default:
  case STRSCAN_I64:
  case STRSCAN_U64:
    o->u64 = neg ? ~x+1u : x;
    break;
  }
  return fmt;
}